

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdleDecommitPageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::IdleDecommitPageAllocator::ShutdownIdleDecommit(IdleDecommitPageAllocator *this)

{
  (this->super_PageAllocator).idleDecommitEnterCount = 1;
  this->hasDecommitTimer = false;
  return;
}

Assistant:

void
IdleDecommitPageAllocator::ShutdownIdleDecommit()
{
    // The recycler thread should have died already
    // Just set the state
    idleDecommitEnterCount = 1;
#ifdef IDLE_DECOMMIT_ENABLED
    hasDecommitTimer = false;
#endif
}